

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

bool __thiscall
ON__LayerPerViewSettings::Write
          (ON__LayerPerViewSettings *this,ON_Layer *layer,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  byte bVar2;
  uint bits;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(binary_archive,0x40008000,1,2);
  if (bVar1) {
    bits = SettingsMask(this);
    bVar1 = ON_BinaryArchive::WriteInt(binary_archive,1,&bits);
    if ((!bVar1) ||
       ((bVar2 = 1, bits != 0 &&
        (((((bVar1 = ON_BinaryArchive::WriteUuid(binary_archive,&this->m_viewport_id), !bVar1 ||
            (((bits & 2) != 0 &&
             (bVar1 = ON_BinaryArchive::WriteColor(binary_archive,&this->m_color), !bVar1)))) ||
           (((bits & 4) != 0 &&
            (bVar1 = ON_BinaryArchive::WriteColor(binary_archive,&this->m_plot_color), !bVar1)))) ||
          ((((bits & 8) != 0 &&
            (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->m_plot_weight_mm), !bVar1))
           || (((bits & 0x10) != 0 &&
               ((bVar1 = ON_BinaryArchive::WriteChar(binary_archive,this->m_visible), !bVar1 ||
                (bVar1 = ON_BinaryArchive::WriteChar(binary_archive,this->m_visible), !bVar1))))))))
         || (((bits & 0x20) != 0 &&
             (bVar1 = ON_BinaryArchive::WriteChar(binary_archive,this->m_persistent_visibility),
             !bVar1)))))))) {
      bVar2 = 0;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(binary_archive);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON__LayerPerViewSettings::Write(const ON_Layer& layer, ON_BinaryArchive& binary_archive) const
{
  if ( !binary_archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2) )
    return false;

  bool rcc = false;
  for(;;)
  {
    // This complicated "bits" stuff is to minimize number of bytes
    // written in the file.  Even though long term storage space is 
    // nearly free, we have lots of customers who complain about 
    // large file size and so ...
    unsigned int bits = SettingsMask();
    if ( !binary_archive.WriteInt(1,&bits) )
      break;
    
    if ( 0 == bits )
    {
      rcc = true;
      break; // all settings are defaults or viewport_id is nil
    }

    if ( !binary_archive.WriteUuid(m_viewport_id) )
      break;

    if ( 0 != (ON_Layer::per_viewport_color & bits) )
    {
      if  ( !binary_archive.WriteColor(m_color) )
        break;
    }

    if ( 0 != (ON_Layer::per_viewport_plot_color & bits) )
    {
      if ( !binary_archive.WriteColor(m_plot_color) )
        break;
    }

    if ( 0 != (ON_Layer::per_viewport_plot_weight & bits) )
    {
      if ( !binary_archive.WriteDouble(m_plot_weight_mm) )
        break;
    }

    if ( 0 != (ON_Layer::per_viewport_visible & bits) )
    {
      if ( !binary_archive.WriteChar(m_visible) )
        break;
      // version 1.1 addition
      if ( !binary_archive.WriteChar(m_visible) ) // (makes old a file old rhinos can read)
        break;
    }

    // 1.2 addition
    if ( 0 != (ON_Layer::per_viewport_persistent_visibility & bits) )
    {
      if ( !binary_archive.WriteChar(m_persistent_visibility) )
        break;
    }

    rcc = true;
    break;
  }

  if ( !binary_archive.EndWrite3dmChunk() )
    rcc = false;

  return rcc;
}